

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect __thiscall ImGuiWindow::MenuBarRect(ImGuiWindow *this)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  float local_28;
  
  fVar4 = 0.0;
  if ((this->Flags & 1) == 0) {
    fVar4 = GImGui->FontBaseSize * this->FontWindowScale;
    if (this->ParentWindow != (ImGuiWindow *)0x0) {
      fVar4 = fVar4 * this->ParentWindow->FontWindowScale;
    }
    fVar1 = (GImGui->Style).FramePadding.y;
    fVar4 = fVar1 + fVar1 + fVar4;
  }
  fVar4 = (this->Pos).y + fVar4;
  IVar2 = this->SizeFull;
  fVar1 = (this->Pos).x;
  IVar5.Min.y = fVar4;
  IVar5.Min.x = fVar1;
  fVar3 = MenuBarHeight(this);
  local_28 = IVar2.x;
  IVar5.Max.x = local_28 + fVar1;
  IVar5.Max.y = fVar3 + fVar4;
  return IVar5;
}

Assistant:

ImRect      MenuBarRect() const     { float y1 = Pos.y + TitleBarHeight(); return ImRect(Pos.x, y1, Pos.x + SizeFull.x, y1 + MenuBarHeight()); }